

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.c
# Opt level: O0

void err_msg_system(err_lvl_t lvl,char *path,long ln,char *fmt,...)

{
  int __errnum;
  err_cb_f p_Var1;
  void *pvVar2;
  char in_AL;
  int *piVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_518 [32];
  undefined8 local_4f8;
  undefined8 local_4f0;
  undefined8 local_4e8;
  undefined8 local_4d8;
  undefined8 local_4c8;
  undefined8 local_4b8;
  undefined8 local_4a8;
  undefined8 local_498;
  undefined8 local_488;
  undefined8 local_478;
  char *local_460;
  char *fname;
  va_list ap;
  char local_438 [8];
  char msg [1024];
  int local_errno;
  char *fmt_local;
  long ln_local;
  char *path_local;
  err_lvl_t lvl_local;
  
  if (in_AL != '\0') {
    local_4e8 = in_XMM0_Qa;
    local_4d8 = in_XMM1_Qa;
    local_4c8 = in_XMM2_Qa;
    local_4b8 = in_XMM3_Qa;
    local_4a8 = in_XMM4_Qa;
    local_498 = in_XMM5_Qa;
    local_488 = in_XMM6_Qa;
    local_478 = in_XMM7_Qa;
  }
  local_4f8 = in_R8;
  local_4f0 = in_R9;
  piVar3 = __errno_location();
  __errnum = *piVar3;
  if ((err_cb != (err_cb_f)0x0) && (min_loglevel <= lvl)) {
    ap[0].overflow_arg_area = local_518;
    ap[0]._0_8_ = &stack0x00000008;
    fname._4_4_ = 0x30;
    fname._0_4_ = 0x20;
    vsnprintf(local_438,0x400,fmt,&fname);
    pvVar2 = err_user_data;
    p_Var1 = err_cb;
    if (path == (char *)0x0) {
      pcVar6 = strerror(__errnum);
      (*p_Var1)(pvVar2,lvl,"%s: %s\n",local_438,pcVar6);
    }
    else {
      pcVar4 = path2basename(path);
      pvVar2 = err_user_data;
      p_Var1 = err_cb;
      pcVar6 = err_level[1];
      local_460 = pcVar4;
      if (lvl == ERR_INFO) {
        pcVar5 = strerror(__errnum);
        (*p_Var1)(pvVar2,ERR_INFO,"%s: %s(%ld): %s: %s\n",pcVar6,pcVar4,ln,local_438,pcVar5);
      }
      else {
        pcVar6 = err_level[lvl];
        pcVar5 = strerror(__errnum);
        (*p_Var1)(pvVar2,lvl,"%s: \"%s\", line %ld: %s: %s\n",pcVar6,pcVar4,ln,local_438,pcVar5);
      }
    }
  }
  return;
}

Assistant:

void
err_msg_system(err_lvl_t lvl, const char *path, long ln, const char *fmt, ...)
{
    int local_errno = errno;
    
    char msg[1024];
    va_list ap;

    if (!err_cb)
        return;
    if (lvl < min_loglevel)
        return;

    va_start(ap, fmt);
    vsnprintf(msg, sizeof(msg), fmt, ap);
    va_end(ap);

    if (path) {
        const char *fname = path2basename(path);
        if (lvl == ERR_INFO)
            err_cb(err_user_data, lvl, "%s: %s(%ld): %s: %s\n", err_level[lvl], fname, ln, msg, strerror(local_errno));
        else
    	    err_cb(err_user_data, lvl, "%s: \"%s\", line %ld: %s: %s\n", err_level[lvl], fname, ln, msg, strerror(local_errno));
    } else {
        err_cb(err_user_data, lvl, "%s: %s\n", msg, strerror(local_errno));
    }
}